

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_handler.hpp
# Opt level: O2

void asio::detail::
     wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:884:26),_asio::any_io_executor>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  _func_void_any_executor_base_ptr_function_ptr *p_Var1;
  BrokerBase *pBVar2;
  activeProtector *paVar3;
  undefined8 uVar4;
  error_category *peVar5;
  long *plVar6;
  undefined8 uVar7;
  function_view fVar8;
  allocator<void> local_d1;
  function local_d0;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26),_std::error_code>
  handler;
  handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26),_asio::any_io_executor,_void>
  w;
  ptr local_48;
  ptr local_30;
  
  local_48.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26),_asio::any_io_executor>
                *)base;
  local_48.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26),_asio::any_io_executor>
                *)base;
  execution::
  any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  ::any_executor((any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                  *)&w,(any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                        *)&base[2].task_result_);
  handler.handler_.this = (BrokerBase *)base[2].next_;
  handler.handler_.active = (activeProtector *)base[2].func_;
  local_48.h = &handler.handler_;
  handler.arg1_._0_8_ = base[1].next_;
  handler.arg1_._M_cat = (error_category *)base[1].func_;
  ptr::reset(&local_48);
  peVar5 = handler.arg1_._M_cat;
  uVar4 = handler.arg1_._0_8_;
  paVar3 = handler.handler_.active;
  pBVar2 = handler.handler_.this;
  if (owner != (void *)0x0) {
    if (w.
        super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
        .executor_.
        super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
        .super_any_executor_base.target_ == (void *)0x0) {
      binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:884:26),_std::error_code>
      ::operator()(&handler);
    }
    else if ((w.
              super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
              .executor_.
              super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
              .super_any_executor_base.target_fns_)->blocking_execute ==
             (_func_void_any_executor_base_ptr_function_view *)0x0) {
      p_Var1 = (w.
                super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
                .executor_.
                super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                .super_any_executor_base.target_fns_)->execute;
      local_30.a = &local_d1;
      plVar6 = (long *)__tls_get_addr(&PTR_004e0e70);
      if (*plVar6 == 0) {
        uVar7 = 0;
      }
      else {
        uVar7 = *(undefined8 *)(*plVar6 + 8);
      }
      local_d0.impl_ =
           (impl_base *)
           thread_info_base::allocate<asio::detail::thread_info_base::executor_function_tag>
                     (uVar7,0x30,8);
      local_30.p = (impl<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26),_std::error_code>,_std::allocator<void>_>
                    *)0x0;
      local_d0.impl_[1].complete_ = (_func_void_impl_base_ptr_bool *)pBVar2;
      local_d0.impl_[2].complete_ = (_func_void_impl_base_ptr_bool *)paVar3;
      local_d0.impl_[3].complete_ = (_func_void_impl_base_ptr_bool *)uVar4;
      local_d0.impl_[4].complete_ = (_func_void_impl_base_ptr_bool *)peVar5;
      (local_d0.impl_)->complete_ =
           executor_function::
           complete<asio::detail::binder1<helics::BrokerBase::queueProcessingLoop()::__0,std::error_code>,std::allocator<void>>
      ;
      local_30.v = (void *)0x0;
      executor_function::
      impl<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:884:26),_std::error_code>,_std::allocator<void>_>
      ::ptr::reset(&local_30);
      (*p_Var1)((any_executor_base *)&w,&local_d0);
      executor_function::~executor_function(&local_d0);
    }
    else {
      fVar8.function_ = &handler;
      fVar8.complete_ =
           executor_function_view::
           complete<asio::detail::binder1<helics::BrokerBase::queueProcessingLoop()::__0,std::error_code>>
      ;
      (*(w.
         super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
         .executor_.
         super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
         .super_any_executor_base.target_fns_)->blocking_execute)((any_executor_base *)&w,fVar8);
    }
  }
  execution::detail::any_executor_base::~any_executor_base((any_executor_base *)&w);
  ptr::reset(&local_48);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    wait_handler* h(static_cast<wait_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };

    ASIO_HANDLER_COMPLETION((*h));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        static_cast<handler_work<Handler, IoExecutor>&&>(
          h->work_));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder1<Handler, asio::error_code>
      handler(h->handler_, h->ec_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }